

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O3

void mcode_protect(jit_State *J,int prot)

{
  int iVar1;
  
  if (J->mcprot != prot) {
    iVar1 = mprotect(J->mcarea,J->szmcarea,prot);
    if (iVar1 != 0) {
      mcode_protfail(J);
    }
    J->mcprot = prot;
  }
  return;
}

Assistant:

static void mcode_protect(jit_State *J, int prot)
{
  if (J->mcprot != prot) {
    if (LJ_UNLIKELY(mcode_setprot(J->mcarea, J->szmcarea, prot)))
      mcode_protfail(J);
    J->mcprot = prot;
  }
}